

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall cmFindLibraryHelper::cmFindLibraryHelper(cmFindLibraryHelper *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *pcVar3;
  char *pcVar4;
  char *pcVar5;
  cmState *this_00;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  char *local_60;
  char *suffixes_list;
  string local_50;
  char *local_30;
  char *prefixes_list;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmFindLibraryHelper *this_local;
  
  this->Makefile = mf;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Prefixes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Suffixes);
  std::__cxx11::string::string((string *)&this->PrefixRegexStr);
  std::__cxx11::string::string((string *)&this->SuffixRegexStr);
  std::__cxx11::string::string((string *)&this->BestPath);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::vector
            (&this->Names);
  std::__cxx11::string::string((string *)&this->TestPath);
  pcVar3 = cmMakefile::GetGlobalGenerator(this->Makefile);
  this->GG = pcVar3;
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"CMAKE_FIND_LIBRARY_PREFIXES",
             (allocator *)((long)&suffixes_list + 7));
  pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&suffixes_list + 7));
  pcVar1 = this->Makefile;
  local_30 = pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"CMAKE_FIND_LIBRARY_SUFFIXES",&local_81);
  pcVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pcVar4 = local_30;
  local_60 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,pcVar4,&local_a9);
  cmSystemTools::ExpandListArgument(&local_a8,&this->Prefixes,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pcVar4 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,pcVar4,&local_d1);
  cmSystemTools::ExpandListArgument(&local_d0,&this->Suffixes,true);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  RegexFromList(this,&this->PrefixRegexStr,&this->Prefixes);
  RegexFromList(this,&this->SuffixRegexStr,&this->Suffixes);
  this_00 = cmMakefile::GetState(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",&local_f9);
  bVar2 = cmState::GetGlobalPropertyAsBool(this_00,&local_f8);
  this->OpenBSD = bVar2;
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  return;
}

Assistant:

cmFindLibraryHelper::cmFindLibraryHelper(cmMakefile* mf):
  Makefile(mf)
{
  this->GG = this->Makefile->GetGlobalGenerator();

  // Collect the list of library name prefixes/suffixes to try.
  const char* prefixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_PREFIXES");
  const char* suffixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_SUFFIXES");
  cmSystemTools::ExpandListArgument(prefixes_list, this->Prefixes, true);
  cmSystemTools::ExpandListArgument(suffixes_list, this->Suffixes, true);
  this->RegexFromList(this->PrefixRegexStr, this->Prefixes);
  this->RegexFromList(this->SuffixRegexStr, this->Suffixes);

  // Check whether to use OpenBSD-style library version comparisons.
  this->OpenBSD =
    this->Makefile->GetState()
        ->GetGlobalPropertyAsBool("FIND_LIBRARY_USE_OPENBSD_VERSIONING");
}